

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O0

void __thiscall
Assimp::MD2Importer::InternReadFile
          (MD2Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  aiVector3D *vOut;
  Header *pHVar1;
  uint uVar2;
  IOStream *__p;
  pointer pIVar3;
  DeadlyImportError *pDVar4;
  reference pvVar5;
  aiNode *this_00;
  uint *puVar6;
  aiMaterial **ppaVar7;
  aiMaterial *this_01;
  aiMesh **ppaVar8;
  aiMesh *this_02;
  ulong *puVar9;
  ulong uVar10;
  aiVector3t<float> *paVar11;
  char *__s;
  size_t sVar12;
  Logger *pLVar13;
  float *pfVar14;
  aiFace *paVar15;
  aiVector3t<float> *local_ee8;
  aiVector3t<float> *local_e90;
  aiVector3t<float> *local_e68;
  aiFace *local_e40;
  aiVector3D *pcOut;
  aiVector3D *vNormal;
  aiVector3D *vec;
  uint iIndex;
  uint c;
  uint i;
  float fDivisorV;
  float fDivisorU;
  uint iCurrent;
  aiString sz;
  aiString szName;
  aiColor3D clr_1;
  ai_uint32 iLen;
  aiString szString;
  aiColor3D clr;
  Skin *pcSkins;
  aiMaterial *paStack_128;
  int iMode;
  aiMaterial *pcHelper;
  Vertex *pcVerts;
  TexCoord *pcTexCoords;
  Triangle *pcTriangles;
  Frame *pcFrame;
  aiMesh *pcMesh;
  undefined1 local_f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  string local_d0;
  undefined1 local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  MD2Importer *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar3 == (pointer)0x0) {
    local_a9 = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open MD2 file ",pFile);
    std::operator+(&local_88,&local_a8,"");
    DeadlyImportError::DeadlyImportError(pDVar4,&local_88);
    local_a9 = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  uVar2 = (*pIVar3->_vptr_IOStream[6])();
  this->fileSize = uVar2;
  if (0x43 < this->fileSize) {
    uVar2 = this->fileSize;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&pcMesh + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,(ulong)uVar2,
               (allocator<unsigned_char> *)((long)&pcMesh + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&pcMesh + 7));
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,0);
    (*pIVar3->_vptr_IOStream[2])(pIVar3,pvVar5,1,(ulong)this->fileSize);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,0);
    this->mBuffer = pvVar5;
    this->m_pcHeader = (Header *)this->mBuffer;
    ValidateHeader(this);
    pScene->mNumMaterials = 1;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    pScene->mRootNode->mNumMeshes = 1;
    puVar6 = (uint *)operator_new__(4);
    pScene->mRootNode->mMeshes = puVar6;
    *pScene->mRootNode->mMeshes = 0;
    ppaVar7 = (aiMaterial **)operator_new__(8);
    pScene->mMaterials = ppaVar7;
    this_01 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_01);
    *pScene->mMaterials = this_01;
    pScene->mNumMeshes = 1;
    ppaVar8 = (aiMesh **)operator_new__(8);
    pScene->mMeshes = ppaVar8;
    this_02 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_02);
    *pScene->mMeshes = this_02;
    this_02->mPrimitiveTypes = 4;
    pHVar1 = this->m_pcHeader;
    pcTriangles = (Triangle *)
                  ((long)&pHVar1->magic +
                  (ulong)(pHVar1->frameSize * this->configFrameID) + (ulong)pHVar1->offsetFrames);
    pcTexCoords = (TexCoord *)
                  ((long)&this->m_pcHeader->magic + (ulong)this->m_pcHeader->offsetTriangles);
    pcVerts = (Vertex *)((long)&this->m_pcHeader->magic + (ulong)this->m_pcHeader->offsetTexCoords);
    pcHelper = (aiMaterial *)(pcTriangles[3].vertexIndices + 2);
    this_02->mNumFaces = this->m_pcHeader->numTriangles;
    uVar10 = (ulong)this->m_pcHeader->numTriangles;
    pcFrame = (Frame *)this_02;
    puVar9 = (ulong *)operator_new__(uVar10 << 4 | 8);
    *puVar9 = uVar10;
    paVar15 = (aiFace *)(puVar9 + 1);
    if (uVar10 != 0) {
      local_e40 = paVar15;
      do {
        aiFace::aiFace(local_e40);
        local_e40 = local_e40 + 1;
      } while (local_e40 != paVar15 + uVar10);
    }
    *(aiFace **)(pcFrame[4].name + 8) = paVar15;
    pcFrame->scale[1] = (float)((int)pcFrame->scale[2] * 3);
    uVar10 = (ulong)(uint)pcFrame->scale[1];
    paVar11 = (aiVector3t<float> *)operator_new__(uVar10 * 0xc);
    if (uVar10 != 0) {
      local_e68 = paVar11;
      do {
        aiVector3t<float>::aiVector3t(local_e68);
        local_e68 = local_e68 + 1;
      } while (local_e68 != paVar11 + uVar10);
    }
    *(aiVector3t<float> **)(pcFrame->translate + 1) = paVar11;
    uVar10 = (ulong)(uint)pcFrame->scale[1];
    paVar11 = (aiVector3t<float> *)operator_new__(uVar10 * 0xc);
    if (uVar10 != 0) {
      local_e90 = paVar11;
      do {
        aiVector3t<float>::aiVector3t(local_e90);
        local_e90 = local_e90 + 1;
      } while (local_e90 != paVar11 + uVar10);
    }
    *(aiVector3t<float> **)pcFrame->name = paVar11;
    paStack_128 = *pScene->mMaterials;
    pcSkins._4_4_ = 2;
    aiMaterial::AddProperty<int>(paStack_128,(int *)((long)&pcSkins + 4),1,"$mat.shadingm",0,0);
    if ((this->m_pcHeader->numTexCoords == 0) || (this->m_pcHeader->numSkins == 0)) {
      aiColor3D::aiColor3D((aiColor3D *)(szName.data + 0x3f8));
      szName.data[0x3f8] = -0x66;
      szName.data[0x3f9] = -0x67;
      szName.data[0x3fa] = '\x19';
      szName.data[0x3fb] = '?';
      szName.data[0x3fc] = -0x66;
      szName.data[0x3fd] = -0x67;
      szName.data[0x3fe] = '\x19';
      szName.data[0x3ff] = '?';
      clr_1.r = 0.6;
      aiMaterial::AddProperty<aiColor3D>
                (paStack_128,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty<aiColor3D>
                (paStack_128,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.specular",0,0);
      szName.data[0x3f8] = -0x33;
      szName.data[0x3f9] = -0x34;
      szName.data[0x3fa] = 'L';
      szName.data[0x3fb] = '=';
      szName.data[0x3fc] = -0x33;
      szName.data[0x3fd] = -0x34;
      szName.data[0x3fe] = 'L';
      szName.data[0x3ff] = '=';
      clr_1.r = 0.05;
      aiMaterial::AddProperty<aiColor3D>
                (paStack_128,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.ambient",0,0);
      aiString::aiString((aiString *)(sz.data + 0x3f8));
      aiString::Set((aiString *)(sz.data + 0x3f8),"DefaultMaterial");
      aiMaterial::AddProperty(paStack_128,(aiString *)(sz.data + 0x3f8),"?mat.name",0,0);
      aiString::aiString((aiString *)&fDivisorU);
      aiString::Set((aiString *)&fDivisorU,"$texture_dummy.bmp");
      aiMaterial::AddProperty(paStack_128,(aiString *)&fDivisorU,"$tex.file",1,0);
    }
    else {
      __s = (char *)((long)&this->m_pcHeader->magic + (ulong)this->m_pcHeader->offsetSkins);
      aiColor3D::aiColor3D((aiColor3D *)(szString.data + 0x3f8));
      szString.data[0x3f8] = '\0';
      szString.data[0x3f9] = '\0';
      szString.data[0x3fa] = -0x80;
      szString.data[0x3fb] = '?';
      szString.data[0x3fc] = '\0';
      szString.data[0x3fd] = '\0';
      szString.data[0x3fe] = -0x80;
      szString.data[0x3ff] = '?';
      aiMaterial::AddProperty<aiColor3D>
                (paStack_128,(aiColor3D *)(szString.data + 0x3f8),1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty<aiColor3D>
                (paStack_128,(aiColor3D *)(szString.data + 0x3f8),1,"$clr.specular",0,0);
      szString.data[0x3f8] = -0x33;
      szString.data[0x3f9] = -0x34;
      szString.data[0x3fa] = 'L';
      szString.data[0x3fb] = '=';
      szString.data[0x3fc] = -0x33;
      szString.data[0x3fd] = -0x34;
      szString.data[0x3fe] = 'L';
      szString.data[0x3ff] = '=';
      aiMaterial::AddProperty<aiColor3D>
                (paStack_128,(aiColor3D *)(szString.data + 0x3f8),1,"$clr.ambient",0,0);
      if (*__s == '\0') {
        pLVar13 = DefaultLogger::get();
        Logger::warn(pLVar13,"Texture file name has zero length. It will be skipped.");
      }
      else {
        aiString::aiString((aiString *)&clr_1.b);
        sVar12 = strlen(__s);
        clr_1.g = (ai_real)sVar12;
        memcpy(&iLen,__s,sVar12 & 0xffffffff);
        szString.data[(ulong)(uint)clr_1.g - 8] = '\0';
        clr_1.b = clr_1.g;
        aiMaterial::AddProperty(paStack_128,(aiString *)&clr_1.b,"$tex.file",1,0);
      }
    }
    fDivisorV = 0.0;
    i = 0x3f800000;
    c = 0x3f800000;
    if (this->m_pcHeader->numTexCoords != 0) {
      uVar10 = (ulong)(uint)pcFrame->scale[1];
      paVar11 = (aiVector3t<float> *)operator_new__(uVar10 * 0xc);
      if (uVar10 != 0) {
        local_ee8 = paVar11;
        do {
          aiVector3t<float>::aiVector3t(local_ee8);
          local_ee8 = local_ee8 + 1;
        } while (local_ee8 != paVar11 + uVar10);
      }
      *(aiVector3t<float> **)pcFrame[2].name = paVar11;
      pcFrame[4].scale[0] = 2.8026e-45;
      if (this->m_pcHeader->skinWidth == 0) {
        pLVar13 = DefaultLogger::get();
        Logger::error(pLVar13,"MD2: No valid skin width given");
      }
      else {
        i = (uint)(float)this->m_pcHeader->skinWidth;
      }
      if (this->m_pcHeader->skinHeight == 0) {
        pLVar13 = DefaultLogger::get();
        Logger::error(pLVar13,"MD2: No valid skin height given");
      }
      else {
        c = (uint)(float)this->m_pcHeader->skinHeight;
      }
    }
    for (iIndex = 0; iIndex < this->m_pcHeader->numTriangles; iIndex = iIndex + 1) {
      puVar6 = (uint *)operator_new__(0xc);
      (*pScene->mMeshes)->mFaces[iIndex].mIndices = puVar6;
      (*pScene->mMeshes)->mFaces[iIndex].mNumIndices = 3;
      for (vec._4_4_ = 0; vec._4_4_ < 3; vec._4_4_ = vec._4_4_ + 1) {
        vec._0_4_ = (uint)(&pcTexCoords[(ulong)iIndex * 3].s)[vec._4_4_];
        if (this->m_pcHeader->numVertices <= (uint)vec) {
          pLVar13 = DefaultLogger::get();
          Logger::error(pLVar13,"MD2: Vertex index is outside the allowed range");
          vec._0_4_ = this->m_pcHeader->numVertices - 1;
        }
        pfVar14 = (float *)(*(long *)(pcFrame->translate + 1) + (ulong)(uint)fDivisorV * 0xc);
        *pfVar14 = (float)*(byte *)((long)&pcHelper->mProperties + (ulong)(uint)vec * 4) *
                   *(float *)pcTriangles->vertexIndices;
        *pfVar14 = *pfVar14 + *(float *)pcTriangles[1].vertexIndices;
        pfVar14[1] = (float)*(byte *)((long)&pcHelper->mProperties + (ulong)(uint)vec * 4 + 1) *
                     *(float *)(pcTriangles->vertexIndices + 2);
        pfVar14[1] = pfVar14[1] + *(float *)(pcTriangles[1].vertexIndices + 2);
        pfVar14[2] = (float)*(byte *)((long)&pcHelper->mProperties + (ulong)(uint)vec * 4 + 2) *
                     *(float *)(pcTriangles->textureIndices + 1);
        pfVar14[2] = pfVar14[2] + *(float *)(pcTriangles[1].textureIndices + 1);
        vOut = (aiVector3D *)(*(long *)pcFrame->name + (ulong)(uint)fDivisorV * 0xc);
        MD2::LookupNormalIndex
                  (*(uint8_t *)((long)&pcHelper->mProperties + (ulong)(uint)vec * 4 + 3),vOut);
        std::swap<float>(&vOut->z,&vOut->y);
        std::swap<float>(pfVar14 + 2,pfVar14 + 1);
        if (this->m_pcHeader->numTexCoords != 0) {
          vec._0_4_ = (uint)(&pcTexCoords[(ulong)iIndex * 3 + 1].t)[vec._4_4_];
          if (this->m_pcHeader->numTexCoords <= (uint)vec) {
            pLVar13 = DefaultLogger::get();
            Logger::error(pLVar13,"MD2: UV index is outside the allowed range");
            vec._0_4_ = this->m_pcHeader->numTexCoords - 1;
          }
          pfVar14 = (float *)(*(long *)pcFrame[2].name + (ulong)(uint)fDivisorV * 0xc);
          *pfVar14 = (float)*(ushort *)pcVerts[(uint)vec].vertex / (float)i;
          pfVar14[1] = 1.0 - (float)*(ushort *)(pcVerts[(uint)vec].vertex + 2) / (float)c;
        }
        (*pScene->mMeshes)->mFaces[iIndex].mIndices[vec._4_4_] = (uint)fDivisorV;
        fDivisorV = (float)((int)fDivisorV + 1);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_30);
    return;
  }
  mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"MD2 File is too small",
             (allocator<char> *)
             ((long)&mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  DeadlyImportError::DeadlyImportError(pDVar4,&local_d0);
  mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MD2Importer::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD2 file " + pFile + "");

    // check whether the md3 file is large enough to contain
    // at least the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD2::Header))
        throw DeadlyImportError( "MD2 File is too small");

    std::vector<uint8_t> mBuffer2(fileSize);
    file->Read(&mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];


    m_pcHeader = (BE_NCONST MD2::Header*)mBuffer;

#ifdef AI_BUILD_BIG_ENDIAN

    ByteSwap::Swap4(&m_pcHeader->frameSize);
    ByteSwap::Swap4(&m_pcHeader->magic);
    ByteSwap::Swap4(&m_pcHeader->numFrames);
    ByteSwap::Swap4(&m_pcHeader->numGlCommands);
    ByteSwap::Swap4(&m_pcHeader->numSkins);
    ByteSwap::Swap4(&m_pcHeader->numTexCoords);
    ByteSwap::Swap4(&m_pcHeader->numTriangles);
    ByteSwap::Swap4(&m_pcHeader->numVertices);
    ByteSwap::Swap4(&m_pcHeader->offsetEnd);
    ByteSwap::Swap4(&m_pcHeader->offsetFrames);
    ByteSwap::Swap4(&m_pcHeader->offsetGlCommands);
    ByteSwap::Swap4(&m_pcHeader->offsetSkins);
    ByteSwap::Swap4(&m_pcHeader->offsetTexCoords);
    ByteSwap::Swap4(&m_pcHeader->offsetTriangles);
    ByteSwap::Swap4(&m_pcHeader->skinHeight);
    ByteSwap::Swap4(&m_pcHeader->skinWidth);
    ByteSwap::Swap4(&m_pcHeader->version);

#endif

    ValidateHeader();

    // there won't be more than one mesh inside the file
    pScene->mNumMaterials = 1;
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];

    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    // navigate to the begin of the current frame data
	BE_NCONST MD2::Frame* pcFrame = (BE_NCONST MD2::Frame*) ((uint8_t*)
		m_pcHeader + m_pcHeader->offsetFrames + (m_pcHeader->frameSize * configFrameID));

    // navigate to the begin of the triangle data
    MD2::Triangle* pcTriangles = (MD2::Triangle*) ((uint8_t*)
        m_pcHeader + m_pcHeader->offsetTriangles);

    // navigate to the begin of the tex coords data
    BE_NCONST MD2::TexCoord* pcTexCoords = (BE_NCONST MD2::TexCoord*) ((uint8_t*)
        m_pcHeader + m_pcHeader->offsetTexCoords);

    // navigate to the begin of the vertex data
    BE_NCONST MD2::Vertex* pcVerts = (BE_NCONST MD2::Vertex*) (pcFrame->vertices);

#ifdef AI_BUILD_BIG_ENDIAN
    for (uint32_t i = 0; i< m_pcHeader->numTriangles; ++i)
    {
        for (unsigned int p = 0; p < 3;++p)
        {
            ByteSwap::Swap2(& pcTriangles[i].textureIndices[p]);
            ByteSwap::Swap2(& pcTriangles[i].vertexIndices[p]);
        }
    }
    for (uint32_t i = 0; i < m_pcHeader->offsetTexCoords;++i)
    {
        ByteSwap::Swap2(& pcTexCoords[i].s);
        ByteSwap::Swap2(& pcTexCoords[i].t);
    }
    ByteSwap::Swap4( & pcFrame->scale[0] );
    ByteSwap::Swap4( & pcFrame->scale[1] );
    ByteSwap::Swap4( & pcFrame->scale[2] );
    ByteSwap::Swap4( & pcFrame->translate[0] );
    ByteSwap::Swap4( & pcFrame->translate[1] );
    ByteSwap::Swap4( & pcFrame->translate[2] );
#endif

    pcMesh->mNumFaces = m_pcHeader->numTriangles;
    pcMesh->mFaces = new aiFace[m_pcHeader->numTriangles];

    // allocate output storage
    pcMesh->mNumVertices = (unsigned int)pcMesh->mNumFaces*3;
    pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

    // Not sure whether there are MD2 files without texture coordinates
    // NOTE: texture coordinates can be there without a texture,
    // but a texture can't be there without a valid UV channel
    aiMaterial* pcHelper = (aiMaterial*)pScene->mMaterials[0];
    const int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    if (m_pcHeader->numTexCoords && m_pcHeader->numSkins)
    {
        // navigate to the first texture associated with the mesh
        const MD2::Skin* pcSkins = (const MD2::Skin*) ((unsigned char*)m_pcHeader +
            m_pcHeader->offsetSkins);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (pcSkins->name[0])
        {
            aiString szString;
            const ai_uint32 iLen = (ai_uint32) ::strlen(pcSkins->name);
            ::memcpy(szString.data,pcSkins->name,iLen);
            szString.data[iLen] = '\0';
            szString.length = iLen;

            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        else{
            ASSIMP_LOG_WARN("Texture file name has zero length. It will be skipped.");
        }
    }
    else    {
        // apply a default material
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.6f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

        aiString sz;

        // TODO: Try to guess the name of the texture file from the model file name

        sz.Set("$texture_dummy.bmp");
        pcHelper->AddProperty(&sz,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }


    // now read all triangles of the first frame, apply scaling and translation
    unsigned int iCurrent = 0;

    float fDivisorU = 1.0f,fDivisorV = 1.0f;
    if (m_pcHeader->numTexCoords)   {
        // allocate storage for texture coordinates, too
        pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // check whether the skin width or height are zero (this would
        // cause a division through zero)
        if (!m_pcHeader->skinWidth) {
            ASSIMP_LOG_ERROR("MD2: No valid skin width given");
        }
        else fDivisorU = (float)m_pcHeader->skinWidth;
        if (!m_pcHeader->skinHeight){
            ASSIMP_LOG_ERROR("MD2: No valid skin height given");
        }
        else fDivisorV = (float)m_pcHeader->skinHeight;
    }

    for (unsigned int i = 0; i < (unsigned int)m_pcHeader->numTriangles;++i)    {
        // Allocate the face
        pScene->mMeshes[0]->mFaces[i].mIndices = new unsigned int[3];
        pScene->mMeshes[0]->mFaces[i].mNumIndices = 3;

        // copy texture coordinates
        // check whether they are different from the previous value at this index.
        // In this case, create a full separate set of vertices/normals/texcoords
        for (unsigned int c = 0; c < 3;++c,++iCurrent)  {

            // validate vertex indices
            unsigned int iIndex = (unsigned int)pcTriangles[i].vertexIndices[c];
            if (iIndex >= m_pcHeader->numVertices)  {
                ASSIMP_LOG_ERROR("MD2: Vertex index is outside the allowed range");
                iIndex = m_pcHeader->numVertices-1;
            }

            // read x,y, and z component of the vertex
            aiVector3D& vec = pcMesh->mVertices[iCurrent];

            vec.x = (float)pcVerts[iIndex].vertex[0] * pcFrame->scale[0];
            vec.x += pcFrame->translate[0];

            vec.y = (float)pcVerts[iIndex].vertex[1] * pcFrame->scale[1];
            vec.y += pcFrame->translate[1];

            vec.z = (float)pcVerts[iIndex].vertex[2] * pcFrame->scale[2];
            vec.z += pcFrame->translate[2];

            // read the normal vector from the precalculated normal table
            aiVector3D& vNormal = pcMesh->mNormals[iCurrent];
            LookupNormalIndex(pcVerts[iIndex].lightNormalIndex,vNormal);

            // flip z and y to become right-handed
            std::swap((float&)vNormal.z,(float&)vNormal.y);
            std::swap((float&)vec.z,(float&)vec.y);

            if (m_pcHeader->numTexCoords)   {
                // validate texture coordinates
                iIndex = pcTriangles[i].textureIndices[c];
                if (iIndex >= m_pcHeader->numTexCoords) {
                    ASSIMP_LOG_ERROR("MD2: UV index is outside the allowed range");
                    iIndex = m_pcHeader->numTexCoords-1;
                }

                aiVector3D& pcOut = pcMesh->mTextureCoords[0][iCurrent];

                // the texture coordinates are absolute values but we
                // need relative values between 0 and 1
                pcOut.x = pcTexCoords[iIndex].s / fDivisorU;
                pcOut.y = 1.f-pcTexCoords[iIndex].t / fDivisorV;
            }
            pScene->mMeshes[0]->mFaces[i].mIndices[c] = iCurrent;
        }
    }
}